

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::
BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
::isSimple(BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
           *this)

{
  CoordinateOrder CVar1;
  bool bVar2;
  CoordinateOrder *pCVar3;
  bool local_11;
  BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
  *this_local;
  
  bVar2 = View<float,_true,_std::allocator<unsigned_long>_>::isSimple(this->e1_);
  local_11 = false;
  if (bVar2) {
    bVar2 = View<float,_true,_std::allocator<unsigned_long>_>::isSimple(this->e2_);
    local_11 = false;
    if (bVar2) {
      pCVar3 = View<float,_true,_std::allocator<unsigned_long>_>::coordinateOrder(this->e1_);
      CVar1 = *pCVar3;
      pCVar3 = View<float,_true,_std::allocator<unsigned_long>_>::coordinateOrder(this->e2_);
      local_11 = CVar1 == *pCVar3;
    }
  }
  return local_11;
}

Assistant:

const bool isSimple() const
        { return e1_.isSimple() && e2_.isSimple() 
                 && e1_.coordinateOrder() == e2_.coordinateOrder(); }